

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::ForeachLoopListSyntax::ForeachLoopListSyntax
          (ForeachLoopListSyntax *this,Token openParen,NameSyntax *arrayName,Token openBracket,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *loopVariables,Token closeBracket,
          Token closeParen)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  NameSyntax *pNVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  size_t index;
  
  uVar6 = openBracket._0_8_;
  uVar5 = openParen._0_8_;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).kind = ForeachLoopList;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  (this->arrayName).ptr = arrayName;
  (this->openBracket).kind = (short)uVar6;
  (this->openBracket).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->openBracket).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->openBracket).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->openBracket).info = openBracket.info;
  SVar2 = (loopVariables->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(loopVariables->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->loopVariables).super_SyntaxListBase.super_SyntaxNode.parent =
       (loopVariables->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->loopVariables).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->loopVariables).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->loopVariables).super_SyntaxListBase.childCount =
       (loopVariables->super_SyntaxListBase).childCount;
  (this->loopVariables).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0050ae40;
  sVar1 = (loopVariables->elements).size_;
  (this->loopVariables).elements.data_ = (loopVariables->elements).data_;
  (this->loopVariables).elements.size_ = sVar1;
  (this->closeBracket).kind = closeBracket.kind;
  (this->closeBracket).field_0x2 = closeBracket._2_1_;
  (this->closeBracket).numFlags = (NumericTokenFlags)closeBracket.numFlags.raw;
  (this->closeBracket).rawLen = closeBracket.rawLen;
  (this->closeBracket).info = closeBracket.info;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  (arrayName->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
  (this->loopVariables).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar7 = (this->loopVariables).elements.size_ + 1;
  if (1 < uVar7) {
    index = 0;
    do {
      pNVar4 = SeparatedSyntaxList<slang::syntax::NameSyntax>::operator[]
                         (&this->loopVariables,index);
      (pNVar4->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
      index = index + 1;
    } while (uVar7 >> 1 != index);
  }
  return;
}

Assistant:

ForeachLoopListSyntax(Token openParen, NameSyntax& arrayName, Token openBracket, const SeparatedSyntaxList<NameSyntax>& loopVariables, Token closeBracket, Token closeParen) :
        SyntaxNode(SyntaxKind::ForeachLoopList), openParen(openParen), arrayName(&arrayName), openBracket(openBracket), loopVariables(loopVariables), closeBracket(closeBracket), closeParen(closeParen) {
        this->arrayName->parent = this;
        this->loopVariables.parent = this;
        for (auto child : this->loopVariables)
            child->parent = this;
    }